

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void xe::parseTestCaseResultFromData
               (TestResultParser *parser,TestCaseResult *result,TestCaseResultData *data)

{
  TestCaseResult *this;
  TestStatusCode TVar1;
  int iVar2;
  char *pcVar3;
  deUint8 *bytes;
  ulong uVar4;
  Error *pEVar5;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  ParseResult local_24;
  TestCaseResultData *pTStack_20;
  ParseResult parseResult;
  TestCaseResultData *data_local;
  TestCaseResult *result_local;
  TestResultParser *parser_local;
  
  pTStack_20 = data;
  data_local = (TestCaseResultData *)result;
  result_local = (TestCaseResult *)parser;
  pcVar3 = TestCaseResultData::getTestCasePath(data);
  std::__cxx11::string::operator=((string *)data_local,pcVar3);
  data_local->m_statusCode = TESTSTATUSCODE_PASS;
  TVar1 = TestCaseResultData::getStatusCode(pTStack_20);
  *(TestStatusCode *)&data_local->field_0x24 = TVar1;
  pcVar3 = TestCaseResultData::getStatusDetails(pTStack_20);
  std::__cxx11::string::operator=((string *)&data_local->m_statusDetails,pcVar3);
  iVar2 = TestCaseResultData::getDataSize(pTStack_20);
  if (iVar2 < 1) {
    if (*(int *)&data_local->field_0x24 == 0xe) {
      *(undefined4 *)&data_local->field_0x24 = 0xd;
      std::__cxx11::string::operator=
                ((string *)&data_local->m_statusDetails,"Empty test case result");
    }
  }
  else {
    TestResultParser::init((TestResultParser *)result_local,(EVP_PKEY_CTX *)data_local);
    this = result_local;
    bytes = TestCaseResultData::getData(pTStack_20);
    iVar2 = TestCaseResultData::getDataSize(pTStack_20);
    local_24 = TestResultParser::parse((TestResultParser *)this,bytes,iVar2);
    if (*(int *)&data_local->field_0x24 == 0xe) {
      *(undefined4 *)&data_local->field_0x24 = 8;
      if (local_24 == PARSERESULT_ERROR) {
        std::__cxx11::string::operator=
                  ((string *)&data_local->m_statusDetails,"Test case result parsing failed");
      }
      else if (local_24 == PARSERESULT_COMPLETE) {
        std::__cxx11::string::operator=
                  ((string *)&data_local->m_statusDetails,
                   "Test case result is missing <Result> item");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)&data_local->m_statusDetails,"Incomplete test case result");
      }
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    local_5d = 1;
    pEVar5 = (Error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Empty test case path in result",&local_49);
    Error::Error(pEVar5,&local_48);
    local_5d = 0;
    __cxa_throw(pEVar5,&Error::typeinfo,Error::~Error);
  }
  if (data_local->m_statusCode != TESTSTATUSCODE_PENDING) {
    return;
  }
  pEVar5 = (Error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Invalid test case type in result",&local_81);
  Error::Error(pEVar5,&local_80);
  __cxa_throw(pEVar5,&Error::typeinfo,Error::~Error);
}

Assistant:

void parseTestCaseResultFromData (TestResultParser* parser, TestCaseResult* result, const TestCaseResultData& data)
{
	DE_ASSERT(result->resultItems.getNumItems() == 0);

	// Initialize status codes etc. from data.
	result->casePath		= data.getTestCasePath();
	result->caseType		= TESTCASETYPE_SELF_VALIDATE;
	result->statusCode		= data.getStatusCode();
	result->statusDetails	= data.getStatusDetails();

	if (data.getDataSize() > 0)
	{
		parser->init(result);

		const TestResultParser::ParseResult parseResult = parser->parse(data.getData(), data.getDataSize());

		if (result->statusCode == TESTSTATUSCODE_LAST)
		{
			result->statusCode = TESTSTATUSCODE_INTERNAL_ERROR;

			if (parseResult == TestResultParser::PARSERESULT_ERROR)
				result->statusDetails = "Test case result parsing failed";
			else if (parseResult != TestResultParser::PARSERESULT_COMPLETE)
				result->statusDetails = "Incomplete test case result";
			else
				result->statusDetails = "Test case result is missing <Result> item";
		}
	}
	else if (result->statusCode == TESTSTATUSCODE_LAST)
	{
		result->statusCode		= TESTSTATUSCODE_TERMINATED;
		result->statusDetails	= "Empty test case result";
	}

	if (result->casePath.empty())
		throw Error("Empty test case path in result");

	if (result->caseType == TESTCASETYPE_LAST)
		throw Error("Invalid test case type in result");

	DE_ASSERT(result->statusCode != TESTSTATUSCODE_LAST);
}